

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

void Js::DictionaryTypeHandlerBase<unsigned_short>::TraceFixedFieldsBeforeTypeHandlerChange
               (char16 *oldTypeHandlerName,char16 *newTypeHandlerName,DynamicObject *instance,
               DynamicTypeHandler *oldTypeHandler,DynamicType *oldType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  char16_t *pcVar2;
  Type pcVar3;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015b6718,FixMethodPropsPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    pcVar3 = (Type)0x0;
    Output::Print(L"FixedFields: converting 0x%p from %s to %s:\n",instance,oldTypeHandlerName);
    if (oldSingletonInstanceBefore != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar3 = (oldSingletonInstanceBefore->super_RecyclerWeakReferenceBase).strongRef;
    }
    Output::Print(L"   before: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p)\n",
                  oldType,oldTypeHandler,oldSingletonInstanceBefore,pcVar3);
    Output::Print(L"   fixed fields:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])(oldTypeHandler);
    Output::Print(L"\n");
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015bc490,FixMethodPropsPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    Output::Print(L"FixedFields: converting instance from %s to %s:\n",oldTypeHandlerName,
                  newTypeHandlerName);
    pcVar2 = L"!=";
    if (oldSingletonInstanceBefore == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar2 = L"==";
    }
    Output::Print(L"   old singleton before %s null \n",pcVar2);
    Output::Print(L"   fixed fields before:");
    (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5e])(oldTypeHandler);
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::TraceFixedFieldsBeforeTypeHandlerChange(
        const char16* oldTypeHandlerName, const char16* newTypeHandlerName,
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler,
        DynamicType* oldType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: converting 0x%p from %s to %s:\n"), instance, oldTypeHandlerName, newTypeHandlerName);
            Output::Print(_u("   before: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p)\n"),
                oldType, oldTypeHandler, oldSingletonInstanceBefore, oldSingletonInstanceBefore != nullptr ? oldSingletonInstanceBefore->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: converting instance from %s to %s:\n"), oldTypeHandlerName, newTypeHandlerName);
            Output::Print(_u("   old singleton before %s null \n"), oldSingletonInstanceBefore == nullptr ? _u("==") : _u("!="));
            Output::Print(_u("   fixed fields before:"));
            oldTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
        }
    }